

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmosSyncChannel_Generator.cpp
# Opt level: O1

void __thiscall
ASDCP::PCM::AtmosSyncChannelGenerator::AtmosSyncChannelGenerator
          (AtmosSyncChannelGenerator *this,ui16_t bitsPerSample,ui32_t sampleRate,Rational *editRate
          ,byte_t *uuid)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  uint uVar4;
  INT IVar5;
  float *pfVar6;
  uint uVar7;
  undefined6 in_register_00000032;
  ui32_t uVar8;
  
  memset(this,0,0xad);
  (this->m_ADesc).EditRate = *editRate;
  (this->m_ADesc).ChannelCount = 1;
  uVar8 = (ui32_t)CONCAT62(in_register_00000032,bitsPerSample);
  (this->m_ADesc).QuantizationBits = uVar8;
  (this->m_ADesc).AudioSamplingRate = (Rational)((ulong)sampleRate | 0x100000000);
  uVar7 = uVar8 + 7 >> 3;
  (this->m_ADesc).BlockAlign = uVar7;
  (this->m_ADesc).AvgBps = uVar7 * sampleRate;
  uVar3 = *(undefined8 *)(uuid + 8);
  *(undefined8 *)(this->m_audioTrackUUID).abyUUIDBytes = *(undefined8 *)uuid;
  *(undefined8 *)((this->m_audioTrackUUID).abyUUIDBytes + 8) = uVar3;
  uVar1 = editRate->Numerator;
  iVar2 = editRate->Denominator;
  uVar4 = (iVar2 * sampleRate) / uVar1;
  this->m_numSamplesPerFrame = uVar4;
  this->m_numBytesPerFrame = uVar7 * uVar4;
  if (uVar8 == 0x18) {
    IVar5 = SyncEncoderInit(&this->m_syncEncoder,sampleRate,(int)uVar1 / iVar2,
                            &this->m_audioTrackUUID);
    this->m_isSyncEncoderInitialized = IVar5 == 0;
    pfVar6 = (float *)operator_new__((ulong)this->m_numSamplesPerFrame << 2);
    this->m_syncSignalBuffer = pfVar6;
  }
  else {
    this->m_isSyncEncoderInitialized = false;
  }
  return;
}

Assistant:

ASDCP::PCM::AtmosSyncChannelGenerator::AtmosSyncChannelGenerator(ui16_t bitsPerSample, ui32_t sampleRate,
                                                                 const ASDCP::Rational& editRate, const byte_t* uuid)
    : m_syncEncoder(),
      m_audioTrackUUID(),
      m_ADesc(),
      m_syncSignalBuffer(NULL),
      m_numSamplesPerFrame(0),
      m_currentFrameNumber(0),
      m_numBytesPerFrame(0),
      m_isSyncEncoderInitialized(false)
{

    m_ADesc.EditRate = editRate;
    m_ADesc.ChannelCount = 1;
    m_ADesc.QuantizationBits = bitsPerSample;
    m_ADesc.AudioSamplingRate = Rational(sampleRate, 1);
    m_ADesc.BlockAlign = ((bitsPerSample + 7) / 8);
    m_ADesc.AvgBps = (sampleRate * m_ADesc.BlockAlign);

    memcpy(&m_audioTrackUUID.abyUUIDBytes[0], uuid, UUIDlen);
    m_numSamplesPerFrame = (editRate.Denominator * sampleRate) / editRate.Numerator;
    m_numBytesPerFrame = m_numSamplesPerFrame * m_ADesc.BlockAlign;

    if (bitsPerSample == 24)
    {
        ui32_t frameRate = editRate.Numerator/editRate.Denominator; // intentionally allowing for imprecise cast to int
        m_isSyncEncoderInitialized = (SyncEncoderInit(&m_syncEncoder, sampleRate, frameRate, &m_audioTrackUUID) == SYNC_ENCODER_ERROR_NONE);
        m_syncSignalBuffer = new float[m_numSamplesPerFrame];
    }
    else
    {
        m_isSyncEncoderInitialized = false;
    }
}